

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptProxy::Equals
          (JavascriptProxy *this,Var other,BOOL *value,ScriptContext *requestContext)

{
  ImplicitCallFlags *pIVar1;
  bool bVar2;
  uint uVar3;
  
  bVar2 = IsRevoked(this);
  if (!bVar2) {
    bVar2 = (requestContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
            DisableImplicitNoFlag;
    if (bVar2) {
      pIVar1 = &requestContext->threadContext->implicitCallFlags;
      *pIVar1 = *pIVar1 | ImplicitCall_External;
      uVar3 = 0;
    }
    else {
      uVar3 = (uint)((JavascriptProxy *)other == this);
    }
    *value = uVar3;
    return (uint)!bVar2;
  }
  JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"equal");
}

Assistant:

BOOL JavascriptProxy::Equals(__in Var other, __out BOOL* value, ScriptContext* requestContext)
    {
        //RecyclableObject* targetObj;
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("equal"));
        }
        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            *value = FALSE;
            return FALSE;
        }
        *value = (other == this);
        return true;
    }